

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cc
# Opt level: O0

void __thiscall gimage::View::View(View *this,View *v)

{
  Camera *pCVar1;
  undefined8 uVar2;
  View *in_RSI;
  Image<float,_gimage::PixelTraits<float>_> *in_RDI;
  Image<float,_gimage::PixelTraits<float>_> *this_00;
  
  this_00 = in_RDI;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::Image
            ((Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)in_RDI,
             (Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)in_RDI);
  Image<float,_gimage::PixelTraits<float>_>::Image(this_00,in_RDI);
  pCVar1 = getCamera(in_RSI);
  uVar2 = (**(code **)(*(long *)pCVar1 + 0x10))();
  *(undefined8 *)(in_RDI + 2) = uVar2;
  return;
}

Assistant:

View::View(const View &v) : image(v.image), depth(v.depth)
{
  camera=v.getCamera()->clone();
}